

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

TCGTemp * tcg_global_reg_new_internal
                    (TCGContext_conflict9 *s,TCGType_conflict type,TCGReg reg,char *name)

{
  int iVar1;
  undefined4 in_register_00000014;
  
  iVar1 = s->nb_globals;
  s->nb_globals = iVar1 + 1;
  s->nb_temps = iVar1 + 1;
  s->temps[iVar1].mem_offset = 0;
  s->temps[iVar1].name = (char *)0x0;
  s->temps[iVar1].state = 0;
  s->temps[iVar1].state_ptr = (void *)0x0;
  s->temps[iVar1].val = 0;
  s->temps[iVar1].mem_base = (TCGTemp *)0x0;
  *(ulong *)(s->temps + iVar1) = (ulong)type & 0xff | 0x2101010000;
  s->temps[iVar1].name = (char *)CONCAT44(in_register_00000014,reg);
  s->reserved_regs = s->reserved_regs | 1 << ((byte)type & 0x1f);
  return s->temps + iVar1;
}

Assistant:

static TCGTemp *tcg_global_reg_new_internal(TCGContext *s, TCGType type,
                                            TCGReg reg, const char *name)
{
    TCGTemp *ts;

    if (TCG_TARGET_REG_BITS == 32 && type != TCG_TYPE_I32) {
        tcg_abort();
    }

    ts = tcg_global_alloc(s);
    ts->base_type = type;
    ts->type = type;
    ts->fixed_reg = 1;
    ts->reg = reg;
    ts->name = name;
    tcg_regset_set_reg(s->reserved_regs, reg);

    return ts;
}